

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

bool cppforth::Forth::isValidDigit(Char c,int numericBase)

{
  bool bVar1;
  undefined3 in_register_00000039;
  uint uVar2;
  
  uVar2 = CONCAT31(in_register_00000039,c);
  if ((numericBase < 0xb) ||
     ((bVar1 = true, c < 0x41 || numericBase + 0x37U <= uVar2 &&
      (c < 0x61 || numericBase + 0x57U <= uVar2)))) {
    bVar1 = (int)uVar2 < numericBase + 0x30 && 0x2f < c;
  }
  return bVar1;
}

Assistant:

static bool isValidDigit(Char c, int numericBase) {
			if (numericBase > 10) {
				if (('A' <= c) && (c < ('A' + numericBase - 10)))
					return true;
				if (('a' <= c) && (c < ('a' + numericBase - 10)))
					return true;
			}
			return ('0' <= c) && (c < ('0' + numericBase));
		}